

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall ipx::IPM::ComputeStartingPoint(IPM *this)

{
  Vector *x_00;
  ulong __n;
  int iVar1;
  int iVar2;
  Model *pMVar3;
  pointer piVar4;
  pointer pdVar5;
  double *__p;
  double *pdVar6;
  size_t sVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector zl;
  Vector rb;
  Vector xu;
  Vector xl;
  Vector zu;
  Vector y;
  Vector x;
  Vector local_a8;
  Vector local_98;
  Vector local_88;
  Vector local_78;
  Vector local_68;
  Vector local_58;
  Vector local_48;
  double local_38;
  
  pMVar3 = this->iterate_->model_;
  sVar7 = (size_t)pMVar3->num_rows_;
  uVar12 = (long)pMVar3->num_cols_ + sVar7;
  uVar9 = uVar12 * 8;
  local_48._M_size = uVar12;
  local_48._M_data = (double *)operator_new(uVar9);
  memset(local_48._M_data,0,uVar9);
  local_78._M_size = uVar12;
  local_78._M_data = (double *)operator_new(uVar9);
  memset(local_78._M_data,0,uVar9);
  local_88._M_size = uVar12;
  local_88._M_data = (double *)operator_new(uVar9);
  memset(local_88._M_data,0,uVar9);
  __n = sVar7 * 8;
  local_58._M_size = sVar7;
  local_58._M_data = (double *)operator_new(__n);
  memset(local_58._M_data,0,__n);
  local_a8._M_size = uVar12;
  local_a8._M_data = (double *)operator_new(uVar9);
  memset(local_a8._M_data,0,uVar9);
  local_68._M_size = uVar12;
  local_68._M_data = (double *)operator_new(uVar9);
  memset(local_68._M_data,0,uVar9);
  local_98._M_size = sVar7;
  local_98._M_data = (double *)operator_new(__n);
  memset(local_98._M_data,0,__n);
  KKTSolver::Factorize(this->kkt_,(Iterate *)0x0,this->info_);
  if ((this->info_->super_ipx_info).errflag != 0) goto LAB_003a12ac;
  if (local_98._M_size == (pMVar3->b_)._M_size) {
    if (local_98._M_size != 0) {
      pdVar6 = (pMVar3->b_)._M_data;
LAB_003a0bfe:
      memcpy(local_98._M_data,pdVar6,local_98._M_size << 3);
    }
  }
  else {
    if (local_98._M_data != (double *)0x0) {
      operator_delete(local_98._M_data);
    }
    local_98._M_size = (pMVar3->b_)._M_size;
    local_98._M_data = (double *)operator_new(local_98._M_size << 3);
    pdVar6 = (pMVar3->b_)._M_data;
    if (pdVar6 != (double *)0x0) goto LAB_003a0bfe;
  }
  iVar11 = (int)uVar12;
  if (0 < iVar11) {
    pdVar6 = (pMVar3->lb_)._M_data;
    pdVar8 = (pMVar3->ub_)._M_data;
    uVar9 = 0;
    do {
      dVar15 = pdVar6[uVar9];
      if (dVar15 <= 0.0) {
        dVar15 = 0.0;
      }
      dVar14 = pdVar8[uVar9];
      if (dVar15 <= dVar14) {
        dVar14 = dVar15;
      }
      local_48._M_data[uVar9] = dVar14;
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        piVar4 = (pMVar3->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar4[uVar9];
        lVar10 = (long)iVar1;
        iVar2 = piVar4[uVar9 + 1];
        if (iVar1 < iVar2) {
          piVar4 = (pMVar3->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (pMVar3->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            iVar1 = piVar4[lVar10];
            local_98._M_data[iVar1] = pdVar5[lVar10] * -dVar14 + local_98._M_data[iVar1];
            lVar10 = lVar10 + 1;
          } while (iVar2 != lVar10);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar12 & 0xffffffff));
  }
  dVar15 = Infnorm(&local_98);
  if (local_a8._M_size != 0) {
    local_38 = dVar15;
    memset(local_a8._M_data,0,local_a8._M_size << 3);
    dVar15 = local_38;
  }
  KKTSolver::Solve(this->kkt_,&local_a8,&local_98,dVar15 * 0.1,&local_78,&local_58,this->info_);
  if ((this->info_->super_ipx_info).errflag == 0) {
    if (0 < (long)local_48._M_size) {
      pdVar6 = local_48._M_data;
      pdVar8 = local_78._M_data;
      do {
        *pdVar6 = *pdVar8 + *pdVar6;
        pdVar6 = pdVar6 + 1;
        pdVar8 = pdVar8 + 1;
      } while (pdVar8 < local_78._M_data + local_48._M_size);
    }
    if (iVar11 < 1) {
      dVar15 = 0.0;
    }
    else {
      pdVar6 = (pMVar3->lb_)._M_data;
      pdVar8 = (pMVar3->ub_)._M_data;
      dVar15 = 0.0;
      uVar9 = 0;
      do {
        dVar14 = local_48._M_data[uVar9] - pdVar6[uVar9];
        local_78._M_data[uVar9] = dVar14;
        dVar14 = -dVar14;
        if (dVar14 <= dVar15) {
          dVar14 = dVar15;
        }
        dVar15 = pdVar8[uVar9] - local_48._M_data[uVar9];
        local_88._M_data[uVar9] = dVar15;
        dVar15 = -dVar15;
        if (dVar15 <= dVar14) {
          dVar15 = dVar14;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar12 & 0xffffffff) != uVar9);
    }
    dVar15 = dVar15 * 1.5 + 1.0;
    if (0 < (long)local_78._M_size) {
      pdVar6 = local_78._M_data;
      do {
        *pdVar6 = *pdVar6 + dVar15;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < local_78._M_data + local_78._M_size);
    }
    x_00 = &pMVar3->c_;
    if (0 < (long)local_88._M_size) {
      pdVar6 = local_88._M_data;
      do {
        *pdVar6 = *pdVar6 + dVar15;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < local_88._M_data + local_88._M_size);
    }
    dVar15 = Twonorm(x_00);
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      local_38 = dVar15;
      if (local_98._M_size != 0) {
        memset(local_98._M_data,0,local_98._M_size << 3);
      }
      dVar15 = Infnorm(x_00);
      KKTSolver::Solve(this->kkt_,x_00,&local_98,dVar15 * 0.1,&local_a8,&local_58,this->info_);
      if ((this->info_->super_ipx_info).errflag != 0) goto LAB_003a12ac;
      std::valarray<double>::operator=(&local_a8,x_00);
      MultiplyAdd(&pMVar3->AI_,&local_58,-1.0,&local_a8,'T');
      dVar15 = Twonorm(&local_a8);
      if (dVar15 < local_38 * 0.05) {
        if (local_a8._M_size != 0) {
          pdVar6 = (pMVar3->c_)._M_data;
          uVar9 = 0;
          do {
            local_a8._M_data[uVar9] = pdVar6[uVar9] * 0.05 + local_a8._M_data[uVar9];
            uVar9 = uVar9 + 1;
          } while (local_a8._M_size != uVar9);
        }
        if (0 < (long)local_58._M_size) {
          pdVar6 = local_58._M_data;
          do {
            *pdVar6 = *pdVar6 * 0.95;
            pdVar6 = pdVar6 + 1;
          } while (pdVar6 < local_58._M_data + local_58._M_size);
        }
      }
      if (iVar11 < 1) {
        dVar15 = 0.0;
      }
      else {
        pdVar6 = (pMVar3->lb_)._M_data;
        dVar15 = 0.0;
        uVar9 = 0;
        do {
          dVar14 = local_a8._M_data[uVar9];
          local_a8._M_data[uVar9] = 0.0;
          local_68._M_data[uVar9] = 0.0;
          dVar13 = ABS(pdVar6[uVar9]);
          if ((ulong)dVar13 < 0x7ff0000000000000) {
            if ((ulong)ABS((pMVar3->ub_)._M_data[uVar9]) < 0x7ff0000000000000) {
              local_a8._M_data[uVar9] = dVar14 * 0.5;
              local_68._M_data[uVar9] = dVar14 * -0.5;
            }
            else {
              if (0x7fefffffffffffff < (ulong)dVar13) goto LAB_003a1124;
              local_a8._M_data[uVar9] = dVar14;
            }
          }
          else {
LAB_003a1124:
            if ((ulong)ABS((pMVar3->ub_)._M_data[uVar9]) < 0x7ff0000000000000) {
              local_68._M_data[uVar9] = -dVar14;
            }
          }
          dVar14 = -local_a8._M_data[uVar9];
          if (-local_a8._M_data[uVar9] <= dVar15) {
            dVar14 = dVar15;
          }
          dVar15 = -local_68._M_data[uVar9];
          if (-local_68._M_data[uVar9] <= dVar14) {
            dVar15 = dVar14;
          }
          uVar9 = uVar9 + 1;
        } while ((uVar12 & 0xffffffff) != uVar9);
      }
      if (0 < iVar11) {
        dVar15 = dVar15 * 1.5 + 1.0;
        pdVar6 = (pMVar3->lb_)._M_data;
        pdVar8 = (pMVar3->ub_)._M_data;
        uVar9 = 0;
        do {
          if ((ulong)ABS(pdVar6[uVar9]) < 0x7ff0000000000000) {
            local_a8._M_data[uVar9] = local_a8._M_data[uVar9] + dVar15;
          }
          if ((ulong)ABS(pdVar8[uVar9]) < 0x7ff0000000000000) {
            local_68._M_data[uVar9] = local_68._M_data[uVar9] + dVar15;
          }
          uVar9 = uVar9 + 1;
        } while ((uVar12 & 0xffffffff) != uVar9);
      }
    }
    else if (0 < iVar11) {
      pdVar6 = (pMVar3->lb_)._M_data;
      pdVar8 = (pMVar3->ub_)._M_data;
      uVar9 = 0;
      do {
        dVar15 = 1.0;
        if (0x7fefffffffffffff < (ulong)ABS(pdVar6[uVar9])) {
          dVar15 = 0.0;
        }
        local_a8._M_data[uVar9] = dVar15;
        dVar15 = 1.0;
        if (0x7fefffffffffffff < (ulong)ABS(pdVar8[uVar9])) {
          dVar15 = 0.0;
        }
        local_68._M_data[uVar9] = dVar15;
        uVar9 = uVar9 + 1;
      } while ((uVar12 & 0xffffffff) != uVar9);
    }
    if (iVar11 < 1) {
      dVar15 = 1.0;
      dVar14 = 1.0;
      dVar13 = 0.5;
    }
    else {
      dVar15 = 1.0;
      dVar14 = 1.0;
      dVar13 = 1.0;
      uVar9 = 0;
      do {
        if ((ulong)ABS((pMVar3->lb_)._M_data[uVar9]) < 0x7ff0000000000000) {
          dVar15 = dVar15 + local_78._M_data[uVar9];
          dVar14 = dVar14 + local_a8._M_data[uVar9];
          dVar13 = dVar13 + local_78._M_data[uVar9] * local_a8._M_data[uVar9];
        }
        if ((ulong)ABS((pMVar3->ub_)._M_data[uVar9]) < 0x7ff0000000000000) {
          dVar15 = dVar15 + local_88._M_data[uVar9];
          dVar14 = dVar14 + local_68._M_data[uVar9];
          dVar13 = dVar13 + local_88._M_data[uVar9] * local_68._M_data[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while ((uVar12 & 0xffffffff) != uVar9);
      dVar13 = dVar13 * 0.5;
    }
    if (0 < (long)local_78._M_size) {
      pdVar6 = local_78._M_data;
      do {
        *pdVar6 = *pdVar6 + dVar13 / dVar14;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < local_78._M_data + local_78._M_size);
    }
    if (0 < (long)local_88._M_size) {
      pdVar6 = local_88._M_data;
      do {
        *pdVar6 = *pdVar6 + dVar13 / dVar14;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < local_88._M_data + local_88._M_size);
    }
    if (0 < iVar11) {
      pdVar6 = (pMVar3->lb_)._M_data;
      pdVar8 = (pMVar3->ub_)._M_data;
      uVar9 = 0;
      do {
        if ((ulong)ABS(pdVar6[uVar9]) < 0x7ff0000000000000) {
          local_a8._M_data[uVar9] = local_a8._M_data[uVar9] + dVar13 / dVar15;
        }
        if ((ulong)ABS(pdVar8[uVar9]) < 0x7ff0000000000000) {
          local_68._M_data[uVar9] = local_68._M_data[uVar9] + dVar13 / dVar15;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar12 & 0xffffffff) != uVar9);
    }
    Iterate::Initialize(this->iterate_,&local_48,&local_78,&local_88,&local_58,&local_a8,&local_68);
    dVar15 = Iterate::complementarity(this->iterate_);
    this->best_complementarity_ = dVar15;
  }
LAB_003a12ac:
  operator_delete(local_98._M_data);
  operator_delete(local_68._M_data);
  operator_delete(local_a8._M_data);
  operator_delete(local_58._M_data);
  operator_delete(local_88._M_data);
  operator_delete(local_78._M_data);
  operator_delete(local_48._M_data);
  return;
}

Assistant:

void IPM::ComputeStartingPoint() {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& b = model.b();
    const Vector& c = model.c();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector x(n+m), xl(n+m), xu(n+m), y(m), zl(n+m), zu(n+m);
    Vector rb(m);               // workspace

    // Factorize the KKT matrix with the identity matrix in the (1,1) block.
    kkt_->Factorize(nullptr, info_);
    if (info_->errflag)
        return;

    // Set x within its bounds and compute the minimum norm solution dx to
    // AI*dx = (b-AI*x). Then update x := x + dx to obtain a feasible point.
    rb = b;
    for (Int j = 0; j < n+m; j++) {
        double xj = 0.0;
        if (xj < lb[j])
            xj = lb[j];
        if (xj > ub[j])
            xj = ub[j];
        x[j] = xj;
        if (xj != 0.0)
            ScatterColumn(AI, j, -xj, rb);
    }
    double tol = 0.1 * Infnorm(rb);
    zl = 0.0;
    kkt_->Solve(zl, rb, tol, xl, y, info_);
    if (info_->errflag)
        return;
    x += xl;

    // Compute xl, xu and shift to become positive.
    double xinfeas = 0.0;
    for (Int j = 0; j < n+m; j++) {
        xl[j] = x[j]-lb[j];
        xinfeas = std::max(xinfeas, -xl[j]);
        xu[j] = ub[j]-x[j];
        xinfeas = std::max(xinfeas, -xu[j]);
    }
    double xshift1 = 1.0 + 1.5*xinfeas;
    xl += xshift1;
    xu += xshift1;

    const double cnorm = Twonorm(c);
    if (cnorm == 0.0) {
        // Special treatment for zero objective.
        for (Int j = 0; j < n+m; j++) {
            zl[j] = std::isfinite(lb[j]) ? 1.0 : 0.0;
            zu[j] = std::isfinite(ub[j]) ? 1.0 : 0.0;
        }
    } else {
        // Compute y as the least-squares solution to AI'*y=c.
        // Recompute zl = c-AI'*y because the KKT system is solved
        // approximately with a residual in the first block equation.
        rb = 0.0;
        double tol = 0.1 * Infnorm(c);
        kkt_->Solve(c, rb, tol, zl, y, info_);
        if (info_->errflag)
            return;
        zl = c;
        MultiplyAdd(AI, y, -1.0, zl, 'T');

        // When c lies in range(AI'), then the dual slack variables are (close
        // to) zero, and the initial point would be almost complementary but
        // usually not primal feasible. To prevent this from happening, add
        // a fraction of the objective to zl and adjust y. In exact computation
        // this does not affect dual feasibility.
        const double znorm = Twonorm(zl);
        const double rho = 0.05;
        if (znorm < rho*cnorm) {
            zl += rho * c;
            y *= (1.0-rho);
        }

        // Split dual slack solution into zl, zu and shift to become positive.
        double zinfeas = 0.0;
        for (Int j = 0; j < n+m; j++) {
            double zval = zl[j];
            zl[j] = 0.0;
            zu[j] = 0.0;
            if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
                zl[j] = 0.5*zval;
                zu[j] = -0.5*zval;
            }
            else if (std::isfinite(lb[j]))
                zl[j] = zval;
            else if (std::isfinite(ub[j]))
                zu[j] = -zval;
            zinfeas = std::max(zinfeas, -zl[j]);
            zinfeas = std::max(zinfeas, -zu[j]);
        }
        double zshift1 = 1.0 + 1.5*zinfeas;
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                zl[j] += zshift1;
            if (std::isfinite(ub[j]))
                zu[j] += zshift1;
        }
    }

    // Level pairwise complementarity products.
    double xsum = 1.0;
    double zsum = 1.0;
    double mu = 1.0;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j])) {
            xsum += xl[j];
            zsum += zl[j];
            mu += xl[j]*zl[j];
        }
        if (std::isfinite(ub[j])) {
            xsum += xu[j];
            zsum += zu[j];
            mu += xu[j]*zu[j];
        }
    }
    double xshift2 = 0.5*mu/zsum;
    double zshift2 = 0.5*mu/xsum;
    xl += xshift2;
    xu += xshift2;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]))
            zl[j] += zshift2;
        if (std::isfinite(ub[j]))
            zu[j] += zshift2;
    }
    iterate_->Initialize(x, xl, xu, y, zl, zu);
    best_complementarity_ = iterate_->complementarity();
}